

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O1

CAmount wallet::CachedTxGetAvailableCredit(CWallet *wallet,CWalletTx *wtx,isminefilter *filter)

{
  element_type *peVar1;
  bool bVar2;
  bool bVar3;
  CAmount CVar4;
  ulong uVar5;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  undefined8 uVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  uint uVar9;
  pointer *ppuVar11;
  uint uVar12;
  pointer pCVar13;
  long in_FS_OFFSET;
  Txid hashTx;
  undefined1 local_a8 [32];
  undefined1 local_88 [16];
  pointer local_78;
  uchar auStack_70 [8];
  uint32_t local_68;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  pointer local_48;
  uchar auStack_40 [8];
  long local_38;
  ulong uVar10;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar9 = *filter;
  bVar2 = CWallet::IsTxImmatureCoinBase(wallet,wtx);
  if (bVar2) {
    ppuVar11 = (pointer *)0x0;
  }
  else {
    uVar9 = uVar9 & 3;
    uVar10 = (ulong)uVar9;
    if (((uVar9 == 0) || (uVar9 == 3)) ||
       ((wtx->m_amounts[3].m_cached.super__Base_bitset<1UL>._M_w >> ((ulong)*filter & 0x3f) & 1) ==
        0)) {
      bVar2 = true;
      if ((*filter & 4) == 0) {
        bVar2 = CWallet::IsWalletFlagSet(wallet,1);
        bVar2 = !bVar2;
      }
      peVar1 = (wtx->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_58 = *(undefined4 *)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      uStack_54 = *(undefined4 *)
                   ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 4);
      uStack_50 = *(undefined4 *)
                   ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      uStack_4c = *(undefined4 *)
                   ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0xc);
      local_48 = *(pointer *)
                  ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      auStack_40 = *(uchar (*) [8])
                    ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      pCVar13 = (peVar1->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((peVar1->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_finish == pCVar13) {
        ppuVar11 = (pointer *)0x0;
      }
      else {
        uVar12 = 1;
        uVar10 = 0;
        ppuVar11 = (pointer *)0x0;
        do {
          local_68 = uVar12 - 1;
          local_88._0_8_ = CONCAT44(uStack_54,local_58);
          local_88._8_8_ = CONCAT44(uStack_4c,uStack_50);
          local_78 = local_48;
          auStack_70[0] = auStack_40[0];
          auStack_70[1] = auStack_40[1];
          auStack_70[2] = auStack_40[2];
          auStack_70[3] = auStack_40[3];
          auStack_70[4] = auStack_40[4];
          auStack_70[5] = auStack_40[5];
          auStack_70[6] = auStack_40[6];
          auStack_70[7] = auStack_40[7];
          bVar3 = CWallet::IsSpent(wallet,(COutPoint *)local_88);
          if ((!bVar3) &&
             ((bVar2 || (bVar3 = CWallet::IsSpentKey(wallet,&pCVar13[uVar10].scriptPubKey), !bVar3))
             )) {
            CVar4 = OutputGetCredit(wallet,pCVar13 + uVar10,filter);
            ppuVar11 = (pointer *)((long)ppuVar11 + CVar4);
            if ((pointer *)0x775f05a074000 < ppuVar11) {
              this = (runtime_error *)__cxa_allocate_exception(0x10);
              local_a8._0_8_ = local_a8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_a8,"CachedTxGetAvailableCredit","");
              pbVar6 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_a8," : value out of range");
              local_88._0_8_ = (pbVar6->_M_dataplus)._M_p;
              paVar8 = &pbVar6->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._0_8_ == paVar8) {
                local_78 = (pointer)paVar8->_M_allocated_capacity;
                auStack_70 = *(uchar (*) [8])((long)&pbVar6->field_2 + 8);
                local_88._0_8_ = &local_78;
              }
              else {
                local_78 = (pointer)paVar8->_M_allocated_capacity;
              }
              local_88._8_8_ = pbVar6->_M_string_length;
              (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
              pbVar6->_M_string_length = 0;
              (pbVar6->field_2)._M_local_buf[0] = '\0';
              std::runtime_error::runtime_error(this,(string *)local_88);
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
              }
              goto LAB_001ec7ed;
            }
          }
          uVar10 = (ulong)uVar12;
          peVar1 = (wtx->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          pCVar13 = (peVar1->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar5 = ((long)(peVar1->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pCVar13 >> 3) *
                  -0x3333333333333333;
          uVar12 = uVar12 + 1;
        } while (uVar10 <= uVar5 && uVar5 - uVar10 != 0);
      }
      if ((uVar9 != 0) && (uVar9 != 3)) {
        uVar5 = (ulong)*filter;
        if (7 < uVar5) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            uVar7 = std::__throw_out_of_range_fmt
                              ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",
                               uVar5,8);
            if ((pointer *)local_88._0_8_ != ppuVar11) {
              operator_delete((void *)local_88._0_8_,(ulong)(local_78 + 1));
            }
            if ((CWallet *)local_a8._0_8_ != wallet) {
              operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
            }
            if ((char)uVar10 != '\0') {
              __cxa_free_exception(wtx);
            }
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              _Unwind_Resume(uVar7);
            }
          }
          goto LAB_001ec7ed;
        }
        wtx->m_amounts[3].m_cached.super__Base_bitset<1UL>._M_w =
             wtx->m_amounts[3].m_cached.super__Base_bitset<1UL>._M_w | 1L << ((byte)*filter & 0x3f);
        wtx->m_amounts[3].m_value[uVar5] = (CAmount)ppuVar11;
        wtx->m_is_cache_empty = false;
      }
    }
    else {
      ppuVar11 = (pointer *)wtx->m_amounts[3].m_value[*filter];
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (CAmount)ppuVar11;
  }
LAB_001ec7ed:
  __stack_chk_fail();
}

Assistant:

CAmount CachedTxGetAvailableCredit(const CWallet& wallet, const CWalletTx& wtx, const isminefilter& filter)
{
    AssertLockHeld(wallet.cs_wallet);

    // Avoid caching ismine for NO or ALL cases (could remove this check and simplify in the future).
    bool allow_cache = (filter & ISMINE_ALL) && (filter & ISMINE_ALL) != ISMINE_ALL;

    // Must wait until coinbase is safely deep enough in the chain before valuing it
    if (wallet.IsTxImmatureCoinBase(wtx))
        return 0;

    if (allow_cache && wtx.m_amounts[CWalletTx::AVAILABLE_CREDIT].m_cached[filter]) {
        return wtx.m_amounts[CWalletTx::AVAILABLE_CREDIT].m_value[filter];
    }

    bool allow_used_addresses = (filter & ISMINE_USED) || !wallet.IsWalletFlagSet(WALLET_FLAG_AVOID_REUSE);
    CAmount nCredit = 0;
    Txid hashTx = wtx.GetHash();
    for (unsigned int i = 0; i < wtx.tx->vout.size(); i++) {
        const CTxOut& txout = wtx.tx->vout[i];
        if (!wallet.IsSpent(COutPoint(hashTx, i)) && (allow_used_addresses || !wallet.IsSpentKey(txout.scriptPubKey))) {
            nCredit += OutputGetCredit(wallet, txout, filter);
            if (!MoneyRange(nCredit))
                throw std::runtime_error(std::string(__func__) + " : value out of range");
        }
    }

    if (allow_cache) {
        wtx.m_amounts[CWalletTx::AVAILABLE_CREDIT].Set(filter, nCredit);
        wtx.m_is_cache_empty = false;
    }

    return nCredit;
}